

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_oc(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int val;
  TCGv_i32 arg2;
  TCGv_i32 l;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  val = get_field1(s,FLD_O_l1,FLD_C_b4);
  arg2 = tcg_const_i32_s390x(tcg_ctx_00,val);
  gen_helper_oc(tcg_ctx_00,tcg_ctx_00->cc_op,tcg_ctx_00->cpu_env,arg2,o->addr1,o->in2);
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_oc(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 l = tcg_const_i32(tcg_ctx, get_field(s, l1));
    gen_helper_oc(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, l, o->addr1, o->in2);
    tcg_temp_free_i32(tcg_ctx, l);
    set_cc_static(s);
    return DISAS_NEXT;
}